

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

void __thiscall
vkt::sr::ShaderRenderCaseInstance::createSamplerUniform
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,Type textureType,Init textureInit
          ,TextureFormat *texFormat,UVec3 *texSize,TextureData *textureData,Sampler *refSampler,
          deUint32 mipLevels,deUint32 arrayLayers,Parameters textureParams)

{
  int *piVar1;
  deInt32 *pdVar2;
  CompareMode CVar3;
  VkImageType imageType;
  Allocator *pAVar4;
  long *plVar5;
  UVec3 texSize_00;
  Handle<(vk::HandleType)13> HVar6;
  Handle<(vk::HandleType)13> HVar7;
  Handle<(vk::HandleType)20> HVar8;
  undefined8 uVar9;
  VkFormat VVar10;
  VkResult result;
  VkDevice_s *device;
  DeviceDriver *vk;
  UniformInfo *pUVar11;
  _func_int **pp_Var12;
  long *plVar13;
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  *pUVar14;
  VkImageViewType VVar15;
  uint uVar16;
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  local_1e8;
  TextureFormat *local_1d0;
  Move<vk::Handle<(vk::HandleType)9>_> vkTexture;
  deUint32 queueFamilyIndex;
  UVec3 *local_190;
  Move<vk::Handle<(vk::HandleType)13>_> imageView;
  Move<vk::Handle<(vk::HandleType)20>_> sampler;
  undefined1 local_138 [16];
  VkDevice local_128;
  VkImage VStack_120;
  VkImageViewType local_118;
  VkFormat local_114;
  VkComponentMapping local_110;
  VkImageAspectFlags local_100;
  deUint32 local_fc;
  deUint32 local_f8;
  deUint32 local_f4;
  deUint32 local_f0;
  VkSamplerCreateInfo samplerParams;
  undefined8 local_98;
  uint local_90;
  VkImageCreateInfo imageParams;
  
  local_1d0 = texFormat;
  local_190 = texSize;
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    device = (((this->m_sparseContext).
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
               .m_data.ptr)->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  }
  else {
    device = Context::getDevice((this->super_TestInstance).m_context);
  }
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    vk = &((this->m_sparseContext).
           super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
           .m_data.ptr)->m_deviceInterface;
  }
  else {
    vk = (DeviceDriver *)Context::getDeviceInterface((this->super_TestInstance).m_context);
  }
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    queueFamilyIndex =
         ((this->m_sparseContext).
          super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
          .m_data.ptr)->m_queueFamilyIndex;
  }
  else {
    queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  }
  CVar3 = refSampler->compare;
  uVar16 = 0;
  switch(textureType) {
  case TYPE_2D:
    VVar15 = VK_IMAGE_VIEW_TYPE_2D;
    break;
  case TYPE_3D:
    VVar15 = VK_IMAGE_VIEW_TYPE_3D;
    break;
  case TYPE_CUBE_MAP:
    uVar16 = 0x10;
    VVar15 = VK_IMAGE_VIEW_TYPE_CUBE;
    break;
  case TYPE_1D_ARRAY:
    VVar15 = VK_IMAGE_VIEW_TYPE_1D_ARRAY;
    break;
  case TYPE_2D_ARRAY:
    VVar15 = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
    break;
  case TYPE_CUBE_ARRAY:
    uVar16 = 0x10;
    VVar15 = VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
    break;
  default:
    VVar15 = VK_IMAGE_VIEW_TYPE_1D;
    uVar16 = 0;
  }
  imageType = (&DAT_00b26780)[VVar15];
  VVar10 = ::vk::mapTextureFormat(local_1d0);
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    checkSparseSupport(this,imageType);
    uVar16 = uVar16 | 3;
  }
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.extent.width = local_190->m_data[0];
  imageParams.extent.height = local_190->m_data[1];
  imageParams.extent.depth = local_190->m_data[2];
  imageParams.mipLevels = mipLevels;
  imageParams.arrayLayers = arrayLayers;
  imageParams.samples = textureParams.samples;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 6;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 1;
  imageParams.pQueueFamilyIndices = &queueFamilyIndex;
  imageParams.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageParams.flags = uVar16;
  imageParams.imageType = imageType;
  imageParams.format = VVar10;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)local_138,&vk->super_DeviceInterface,
                    device,&imageParams,(VkAllocationCallbacks *)0x0);
  samplerParams._16_8_ = local_128;
  samplerParams.minFilter = (undefined4)VStack_120.m_internal;
  samplerParams.mipmapMode = VStack_120.m_internal._4_4_;
  samplerParams._0_8_ = local_138._0_8_;
  samplerParams.pNext = (void *)local_138._8_8_;
  local_138._0_8_ = 0;
  local_138._8_8_ = (DeviceInterface *)0x0;
  local_128 = (VkDevice)0x0;
  VStack_120.m_internal = 0;
  if (vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)samplerParams._16_8_;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)samplerParams._24_8_;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       samplerParams._0_8_;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)samplerParams.pNext;
  if (local_138._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(local_138 + 8),(VkImage)local_138._0_8_);
  }
  pAVar4 = this->m_memAlloc;
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&samplerParams,&vk->super_DeviceInterface,device,
             (VkImage)vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal);
  uVar16 = 0x64c05d;
  (*pAVar4->_vptr_Allocator[3])(local_138,pAVar4,&samplerParams,0);
  uVar9 = local_138._0_8_;
  if (this->m_imageBackingMode != IMAGE_BACKING_MODE_SPARSE) {
    result = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0xd])
                       (vk,device,
                        vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal,*(undefined8 *)(local_138._0_8_ + 8));
    uVar16 = 0x64c0a7;
    ::vk::checkResult(result,
                      "vk.bindImageMemory(vkDevice, *vkTexture, allocation->getMemory(), allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                      ,0x818);
  }
  if (textureInit == INIT_CLEAR) {
    clearImage(this,refSampler,mipLevels,arrayLayers,
               (VkImage)vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  else if (textureInit == INIT_UPLOAD_DATA) {
    if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
      local_90 = local_190->m_data[2];
      local_98 = *(undefined8 *)local_190->m_data;
      texSize_00.m_data[2] = uVar16;
      texSize_00.m_data._0_8_ = &local_98;
      uploadSparseImage(this,local_1d0,textureData,refSampler,mipLevels,arrayLayers,
                        (VkImage)vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                                 object.m_internal,&imageParams,texSize_00);
    }
    else {
      uploadImage(this,local_1d0,textureData,refSampler,mipLevels,arrayLayers,
                  (VkImage)vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                           m_internal);
    }
  }
  ::vk::mapSampler(&samplerParams,refSampler,local_1d0,0.0,1000.0);
  ::vk::createSampler(&sampler,&vk->super_DeviceInterface,device,&samplerParams,
                      (VkAllocationCallbacks *)0x0);
  local_110.r = textureParams.componentMapping.r;
  local_110.g = textureParams.componentMapping.g;
  local_110.b = textureParams.componentMapping.b;
  local_110.a = textureParams.componentMapping.a;
  local_138._0_4_ = 0xf;
  local_138._8_8_ = (DeviceInterface *)0x0;
  local_128 = (VkDevice)((ulong)local_128 & 0xffffffff00000000);
  VStack_120.m_internal =
       vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_fc = textureParams.baseMipLevel;
  local_f8 = mipLevels - textureParams.baseMipLevel;
  local_f4 = 0;
  local_f0 = arrayLayers;
  local_118 = VVar15;
  local_114 = VVar10;
  local_100 = 2 - (CVar3 == COMPAREMODE_NONE);
  ::vk::createImageView
            (&imageView,&vk->super_DeviceInterface,device,(VkImageViewCreateInfo *)local_138,
             (VkAllocationCallbacks *)0x0);
  HVar8 = sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object;
  HVar6 = imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object;
  pUVar11 = (UniformInfo *)operator_new(0x68);
  HVar7 = imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object;
  pUVar11->_vptr_UniformInfo = (_func_int **)&PTR__SamplerUniform_00d273b0;
  pUVar11[1]._vptr_UniformInfo = (_func_int **)0x0;
  pUVar11[1].type = VK_DESCRIPTOR_TYPE_SAMPLER;
  pUVar11[1].location = 0;
  pUVar11[2]._vptr_UniformInfo = (_func_int **)0x0;
  pUVar11[2].type = VK_DESCRIPTOR_TYPE_SAMPLER;
  pUVar11[2].location = 0;
  pUVar11[3]._vptr_UniformInfo = (_func_int **)0x0;
  pUVar11[3].type = VK_DESCRIPTOR_TYPE_SAMPLER;
  pUVar11[3].location = 0;
  pUVar11[4]._vptr_UniformInfo = (_func_int **)0x0;
  pUVar11[4].type = VK_DESCRIPTOR_TYPE_SAMPLER;
  pUVar11[4].location = 0;
  pUVar11->type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  pUVar11[5]._vptr_UniformInfo = (_func_int **)HVar8.m_internal;
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._0_4_ =
       (undefined4)HVar6.m_internal;
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_ =
       SUB84(HVar6.m_internal,4);
  pUVar11[5].type =
       (undefined4)imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  pUVar11[5].location =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal._4_4_;
  *(undefined4 *)&pUVar11[6]._vptr_UniformInfo = 5;
  pUVar11->location = bindingLocation;
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object = HVar7;
  pp_Var12 = (_func_int **)operator_new(0x20);
  pp_Var12[2] = (_func_int *)
                vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  pp_Var12[3] = (_func_int *)
                vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  *pp_Var12 = (_func_int *)
              vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  pp_Var12[1] = (_func_int *)
                vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
  ;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  plVar13 = (long *)operator_new(0x20);
  *(undefined4 *)(plVar13 + 1) = 0;
  *(undefined4 *)((long)plVar13 + 0xc) = 0;
  *plVar13 = (long)&PTR__SharedPtrState_00d1de50;
  plVar13[2] = (long)pp_Var12;
  *(undefined4 *)(plVar13 + 1) = 1;
  *(undefined4 *)((long)plVar13 + 0xc) = 1;
  plVar5 = *(long **)&pUVar11[1].type;
  if (plVar5 != plVar13) {
    if (plVar5 != (long *)0x0) {
      LOCK();
      plVar5 = plVar5 + 1;
      *(int *)plVar5 = (int)*plVar5 + -1;
      UNLOCK();
      if ((int)*plVar5 == 0) {
        pUVar11[1]._vptr_UniformInfo = (_func_int **)0x0;
        (**(code **)(**(long **)&pUVar11[1].type + 0x10))();
      }
      LOCK();
      piVar1 = (int *)(*(long *)&pUVar11[1].type + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)&pUVar11[1].type != (long *)0x0) {
          (**(code **)(**(long **)&pUVar11[1].type + 8))();
        }
        pUVar11[1].type = VK_DESCRIPTOR_TYPE_SAMPLER;
        pUVar11[1].location = 0;
      }
    }
    pUVar11[1]._vptr_UniformInfo = pp_Var12;
    *(long **)&pUVar11[1].type = plVar13;
    LOCK();
    *(int *)(plVar13 + 1) = (int)plVar13[1] + 1;
    UNLOCK();
    LOCK();
    piVar1 = (int *)(*(long *)&pUVar11[1].type + 0xc);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  LOCK();
  plVar5 = plVar13 + 1;
  *(int *)plVar5 = (int)*plVar5 + -1;
  UNLOCK();
  if ((int)*plVar5 == 0) {
    (**(code **)(*plVar13 + 0x10))(plVar13);
  }
  LOCK();
  piVar1 = (int *)((long)plVar13 + 0xc);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    (**(code **)(*plVar13 + 8))(plVar13);
  }
  pp_Var12 = (_func_int **)operator_new(0x20);
  pp_Var12[2] = (_func_int *)
                imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pp_Var12[3] = (_func_int *)
                imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  *pp_Var12 = (_func_int *)
              imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pp_Var12[1] = (_func_int *)
                imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                m_deviceIface;
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  plVar13 = (long *)operator_new(0x20);
  *(undefined4 *)(plVar13 + 1) = 0;
  *(undefined4 *)((long)plVar13 + 0xc) = 0;
  *plVar13 = (long)&PTR__SharedPtrState_00d1de90;
  plVar13[2] = (long)pp_Var12;
  *(undefined4 *)(plVar13 + 1) = 1;
  *(undefined4 *)((long)plVar13 + 0xc) = 1;
  plVar5 = *(long **)&pUVar11[2].type;
  if (plVar5 != plVar13) {
    if (plVar5 != (long *)0x0) {
      LOCK();
      plVar5 = plVar5 + 1;
      *(int *)plVar5 = (int)*plVar5 + -1;
      UNLOCK();
      if ((int)*plVar5 == 0) {
        pUVar11[2]._vptr_UniformInfo = (_func_int **)0x0;
        (**(code **)(**(long **)&pUVar11[2].type + 0x10))();
      }
      LOCK();
      piVar1 = (int *)(*(long *)&pUVar11[2].type + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)&pUVar11[2].type != (long *)0x0) {
          (**(code **)(**(long **)&pUVar11[2].type + 8))();
        }
        pUVar11[2].type = VK_DESCRIPTOR_TYPE_SAMPLER;
        pUVar11[2].location = 0;
      }
    }
    pUVar11[2]._vptr_UniformInfo = pp_Var12;
    *(long **)&pUVar11[2].type = plVar13;
    LOCK();
    *(int *)(plVar13 + 1) = (int)plVar13[1] + 1;
    UNLOCK();
    LOCK();
    piVar1 = (int *)(*(long *)&pUVar11[2].type + 0xc);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  LOCK();
  plVar5 = plVar13 + 1;
  *(int *)plVar5 = (int)*plVar5 + -1;
  UNLOCK();
  if ((int)*plVar5 == 0) {
    (**(code **)(*plVar13 + 0x10))(plVar13);
  }
  LOCK();
  piVar1 = (int *)((long)plVar13 + 0xc);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    (**(code **)(*plVar13 + 8))(plVar13);
  }
  pp_Var12 = (_func_int **)operator_new(0x20);
  pp_Var12[2] = (_func_int *)
                sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device;
  pp_Var12[3] = (_func_int *)
                sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator;
  *pp_Var12 = (_func_int *)
              sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
  pp_Var12[1] = (_func_int *)
                sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface;
  sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal = 0;
  sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device = (VkDevice)0x0;
  sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  plVar13 = (long *)operator_new(0x20);
  *(undefined4 *)(plVar13 + 1) = 0;
  *(undefined4 *)((long)plVar13 + 0xc) = 0;
  *plVar13 = (long)&PTR__SharedPtrState_00d1e150;
  plVar13[2] = (long)pp_Var12;
  *(undefined4 *)(plVar13 + 1) = 1;
  *(undefined4 *)((long)plVar13 + 0xc) = 1;
  plVar5 = *(long **)&pUVar11[3].type;
  if (plVar5 != plVar13) {
    if (plVar5 != (long *)0x0) {
      LOCK();
      plVar5 = plVar5 + 1;
      *(int *)plVar5 = (int)*plVar5 + -1;
      UNLOCK();
      if ((int)*plVar5 == 0) {
        pUVar11[3]._vptr_UniformInfo = (_func_int **)0x0;
        (**(code **)(**(long **)&pUVar11[3].type + 0x10))();
      }
      LOCK();
      piVar1 = (int *)(*(long *)&pUVar11[3].type + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)&pUVar11[3].type != (long *)0x0) {
          (**(code **)(**(long **)&pUVar11[3].type + 8))();
        }
        pUVar11[3].type = VK_DESCRIPTOR_TYPE_SAMPLER;
        pUVar11[3].location = 0;
      }
    }
    pUVar11[3]._vptr_UniformInfo = pp_Var12;
    *(long **)&pUVar11[3].type = plVar13;
    LOCK();
    *(int *)(plVar13 + 1) = (int)plVar13[1] + 1;
    UNLOCK();
    LOCK();
    piVar1 = (int *)(*(long *)&pUVar11[3].type + 0xc);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  LOCK();
  plVar5 = plVar13 + 1;
  *(int *)plVar5 = (int)*plVar5 + -1;
  UNLOCK();
  if ((int)*plVar5 == 0) {
    (**(code **)(*plVar13 + 0x10))(plVar13);
  }
  LOCK();
  piVar1 = (int *)((long)plVar13 + 0xc);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    (**(code **)(*plVar13 + 8))(plVar13);
  }
  plVar13 = (long *)operator_new(0x20);
  *(undefined4 *)(plVar13 + 1) = 0;
  *(undefined4 *)((long)plVar13 + 0xc) = 0;
  *plVar13 = (long)&PTR__SharedPtrState_00d1fc38;
  plVar13[2] = uVar9;
  *(undefined4 *)(plVar13 + 1) = 1;
  *(undefined4 *)((long)plVar13 + 0xc) = 1;
  plVar5 = *(long **)&pUVar11[4].type;
  if (plVar5 != plVar13) {
    if (plVar5 != (long *)0x0) {
      LOCK();
      plVar5 = plVar5 + 1;
      *(int *)plVar5 = (int)*plVar5 + -1;
      UNLOCK();
      if ((int)*plVar5 == 0) {
        pUVar11[4]._vptr_UniformInfo = (_func_int **)0x0;
        (**(code **)(**(long **)&pUVar11[4].type + 0x10))();
      }
      LOCK();
      piVar1 = (int *)(*(long *)&pUVar11[4].type + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)&pUVar11[4].type != (long *)0x0) {
          (**(code **)(**(long **)&pUVar11[4].type + 8))();
        }
        pUVar11[4].type = VK_DESCRIPTOR_TYPE_SAMPLER;
        pUVar11[4].location = 0;
      }
    }
    pUVar11[4]._vptr_UniformInfo = (_func_int **)uVar9;
    *(long **)&pUVar11[4].type = plVar13;
    LOCK();
    *(int *)(plVar13 + 1) = (int)plVar13[1] + 1;
    UNLOCK();
    LOCK();
    piVar1 = (int *)(*(long *)&pUVar11[4].type + 0xc);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  LOCK();
  plVar5 = plVar13 + 1;
  *(int *)plVar5 = (int)*plVar5 + -1;
  UNLOCK();
  if ((int)*plVar5 == 0) {
    (**(code **)(*plVar13 + 0x10))(plVar13);
  }
  LOCK();
  piVar1 = (int *)((long)plVar13 + 0xc);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    (**(code **)(*plVar13 + 8))(plVar13);
  }
  ::vk::DescriptorSetLayoutBuilder::addBinding
            ((this->m_descriptorSetLayoutBuilder).
             super_UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
             .m_data.ptr,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1,0x7fffffff,(VkSampler *)0x0);
  ::vk::DescriptorPoolBuilder::addType
            ((this->m_descriptorPoolBuilder).
             super_UniqueBase<vk::DescriptorPoolBuilder,_de::DefaultDeleter<vk::DescriptorPoolBuilder>_>
             .m_data.ptr,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
  pUVar14 = (UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
             *)operator_new(0x10);
  (pUVar14->
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  ).m_data.ptr = pUVar11;
  local_1e8.m_state = (SharedPtrStateBase *)0x0;
  local_1e8.m_ptr = pUVar14;
  local_1e8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_1e8.m_state)->strongRefCount = 0;
  (local_1e8.m_state)->weakRefCount = 0;
  (local_1e8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d273d0;
  local_1e8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar14;
  (local_1e8.m_state)->strongRefCount = 1;
  (local_1e8.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>>
  ::
  emplace_back<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>
            ((vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>>
              *)&this->m_uniformInfos,&local_1e8);
  if (local_1e8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar2 = &(local_1e8.m_state)->strongRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if (*pdVar2 == 0) {
      local_1e8.m_ptr =
           (UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
            *)0x0;
      (*(local_1e8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar2 = &(local_1e8.m_state)->weakRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if (*pdVar2 == 0) {
      if (local_1e8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_1e8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_1e8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImageView)
               imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  if (sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)20>_>::operator()
              (&sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter,
               (VkSampler)
               sampler.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal);
  }
  if (vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)vkTexture.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::createSamplerUniform (deUint32						bindingLocation,
													 TextureBinding::Type			textureType,
													 TextureBinding::Init			textureInit,
													 const tcu::TextureFormat&		texFormat,
													 const tcu::UVec3				texSize,
													 const TextureData&				textureData,
													 const tcu::Sampler&			refSampler,
													 deUint32						mipLevels,
													 deUint32						arrayLayers,
													 TextureBinding::Parameters		textureParams)
{
	const VkDevice					vkDevice			= getDevice();
	const DeviceInterface&			vk					= getDeviceInterface();
	const deUint32					queueFamilyIndex	= getUniversalQueueFamilyIndex();

	const bool						isShadowSampler		= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags		aspectMask			= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;
	const VkImageViewType			imageViewType		= textureTypeToImageViewType(textureType);
	const VkImageType				imageType			= viewTypeToImageType(imageViewType);
	const VkFormat					format				= mapTextureFormat(texFormat);
	const bool						isCube				= imageViewType == VK_IMAGE_VIEW_TYPE_CUBE || imageViewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
	VkImageCreateFlags				imageCreateFlags	= isCube ? (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : (VkImageCreateFlags)0;
	VkImageUsageFlags				imageUsageFlags		= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
	Move<VkImage>					vkTexture;
	de::MovePtr<Allocation>			allocation;

	if (m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE)
	{
		checkSparseSupport(imageType);
		imageCreateFlags |= VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT;
	}

	// Create image
	const VkImageCreateInfo			imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,							// VkStructureType			sType;
		DE_NULL,														// const void*				pNext;
		imageCreateFlags,												// VkImageCreateFlags		flags;
		imageType,														// VkImageType				imageType;
		format,															// VkFormat					format;
		{																// VkExtent3D				extent;
			texSize.x(),
			texSize.y(),
			texSize.z()
		},
		mipLevels,														// deUint32					mipLevels;
		arrayLayers,													// deUint32					arrayLayers;
		textureParams.samples,											// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,										// VkImageTiling			tiling;
		imageUsageFlags,												// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,										// VkSharingMode			sharingMode;
		1u,																// deUint32					queueFamilyIndexCount;
		&queueFamilyIndex,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED										// VkImageLayout			initialLayout;
	};

	vkTexture		= createImage(vk, vkDevice, &imageParams);
	allocation		= m_memAlloc.allocate(getImageMemoryRequirements(vk, vkDevice, *vkTexture), MemoryRequirement::Any);

	if (m_imageBackingMode != IMAGE_BACKING_MODE_SPARSE)
	{
		VK_CHECK(vk.bindImageMemory(vkDevice, *vkTexture, allocation->getMemory(), allocation->getOffset()));
	}

	switch (textureInit)
	{
		case TextureBinding::INIT_UPLOAD_DATA:
		{
			// upload*Image functions use cmdCopyBufferToImage, which is invalid for multisample images
			DE_ASSERT(textureParams.samples == VK_SAMPLE_COUNT_1_BIT);

			if (m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE)
			{
				uploadSparseImage(texFormat, textureData, refSampler, mipLevels, arrayLayers, *vkTexture, imageParams, texSize);
			}
			else
			{
				// Upload texture data
				uploadImage(texFormat, textureData, refSampler, mipLevels, arrayLayers, *vkTexture);
			}
			break;
		}
		case TextureBinding::INIT_CLEAR:
			clearImage(refSampler, mipLevels, arrayLayers, *vkTexture);
			break;
		default:
			DE_FATAL("Impossible");
	}

	// Create sampler
	const VkSamplerCreateInfo		samplerParams	= mapSampler(refSampler, texFormat);
	Move<VkSampler>					sampler			= createSampler(vk, vkDevice, &samplerParams);
	const deUint32					baseMipLevel	= textureParams.baseMipLevel;
	const vk::VkComponentMapping	components		= textureParams.componentMapping;
	const VkImageViewCreateInfo		viewParams		=
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType			sType;
		NULL,										// const voide*				pNext;
		0u,											// VkImageViewCreateFlags	flags;
		*vkTexture,									// VkImage					image;
		imageViewType,								// VkImageViewType			viewType;
		format,										// VkFormat					format;
		components,									// VkChannelMapping			channels;
		{
			aspectMask,						// VkImageAspectFlags	aspectMask;
			baseMipLevel,					// deUint32				baseMipLevel;
			mipLevels - baseMipLevel,		// deUint32				mipLevels;
			0,								// deUint32				baseArraySlice;
			arrayLayers						// deUint32				arraySize;
		},											// VkImageSubresourceRange	subresourceRange;
	};

	Move<VkImageView>				imageView		= createImageView(vk, vkDevice, &viewParams);

	const vk::VkDescriptorImageInfo	descriptor		=
	{
		sampler.get(),								// VkSampler				sampler;
		imageView.get(),							// VkImageView				imageView;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,	// VkImageLayout			imageLayout;
	};

	de::MovePtr<SamplerUniform> uniform(new SamplerUniform());
	uniform->type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
	uniform->descriptor = descriptor;
	uniform->location = bindingLocation;
	uniform->image = VkImageSp(new vk::Unique<VkImage>(vkTexture));
	uniform->imageView = VkImageViewSp(new vk::Unique<VkImageView>(imageView));
	uniform->sampler = VkSamplerSp(new vk::Unique<VkSampler>(sampler));
	uniform->alloc = AllocationSp(allocation.release());

	m_descriptorSetLayoutBuilder->addSingleSamplerBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, vk::VK_SHADER_STAGE_ALL, DE_NULL);
	m_descriptorPoolBuilder->addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER);

	m_uniformInfos.push_back(UniformInfoSp(new de::UniquePtr<UniformInfo>(uniform)));
}